

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

cf_errno_t cf_mutex_trylock(cf_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mutex);
  return (cf_errno_t)(iVar1 != 0);
}

Assistant:

cf_errno_t cf_mutex_trylock(cf_mutex_t* mutex) {
#ifdef CF_OS_WIN
    if (!mutex) return CF_EPARAM;

    if (WAIT_OBJECT_0 == WaitForSingleObject(*mutex, 0)) return CF_OK;
    else return CF_NOK;
#else
    if(pthread_mutex_trylock(mutex) == 0) return CF_OK;
    else return CF_NOK;
#endif
}